

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

void StripNewline(char *str)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = str + -1;
  do {
    pcVar3 = pcVar2 + 1;
    pcVar2 = pcVar2 + 1;
  } while (*pcVar3 != '\0');
  do {
    pcVar3 = pcVar2;
    if (pcVar3 <= str) break;
    iVar1 = iscntrl((uint)(byte)pcVar3[-1]);
    pcVar2 = pcVar3 + -1;
  } while (iVar1 != 0);
  *pcVar3 = '\0';
  return;
}

Assistant:

static void StripNewline(char* str)
{
	char* strPtr;
	
	strPtr = str;
	while(*strPtr != '\0')
		strPtr ++;
	
	while(strPtr > str && iscntrl((unsigned char)strPtr[-1]))
		strPtr --;
	*strPtr = '\0';
	
	return;
}